

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_apply_interpolation.h
# Opt level: O0

void ncnn::gridsample_3d_bilinear_apply_interpolation_p8
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  long lVar21;
  long lVar22;
  undefined8 *puVar23;
  undefined8 *in_RDX;
  long *in_RSI;
  long lVar24;
  long *in_RDI;
  __m256 _v;
  __m256 v1;
  __m256 v0;
  __m256 v11;
  __m256 v10;
  __m256 v01;
  __m256 v00;
  __m256 value;
  __m256 v111_val;
  __m256 v110_val;
  __m256 v101_val;
  __m256 v100_val;
  __m256 v011_val;
  __m256 v010_val;
  __m256 v001_val;
  __m256 v000_val;
  float *value_ptr;
  int *offset_ptr;
  int i;
  float *offset_value_ptr;
  float *dstptr;
  float *srcptr;
  int q;
  int grid_size;
  int outd;
  int outh;
  int outw;
  int channels;
  Mat *m_2;
  Mat *m;
  Mat *m_1;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  float fStack_1448;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  float fStack_13c8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  float fStack_1348;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  float fStack_12c8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  int local_f0c;
  int *local_ec0;
  undefined1 (*local_e70) [32];
  int local_e18;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined4 uStack_544;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined4 uStack_504;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined4 uStack_4c4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined4 uStack_484;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2a4;
  
  lVar21 = in_RSI[7];
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  lVar22 = in_RSI[6];
  iVar3 = *(int *)((long)in_RSI + 0x34);
  for (local_e18 = 0; local_e18 < (int)lVar21; local_e18 = local_e18 + 1) {
    lVar24 = *in_RDI + in_RDI[8] * (long)local_e18 * in_RDI[2];
    local_e70 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_e18 * in_RSI[2]);
    local_ec0 = (int *)*in_RDX;
    for (local_f0c = 0; local_f0c < iVar2 * (int)lVar22 * iVar3; local_f0c = local_f0c + 1) {
      if (*local_ec0 < 0) {
        auVar4 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
        local_a00 = auVar5._0_8_;
        uStack_9f8 = auVar5._8_8_;
        uStack_9f0 = auVar4._0_8_;
        uStack_9e8 = auVar4._8_8_;
        local_12a0 = local_a00;
        uStack_1298 = uStack_9f8;
        uStack_1290 = uStack_9f0;
        uStack_1288 = uStack_9e8;
      }
      else {
        puVar23 = (undefined8 *)(lVar24 + (long)*local_ec0 * 4);
        local_12a0 = *puVar23;
        uStack_1298 = puVar23[1];
        uStack_1290 = puVar23[2];
        uStack_1288 = puVar23[3];
      }
      if (local_ec0[1] < 0) {
        auVar4 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
        local_9c0 = auVar5._0_8_;
        uStack_9b8 = auVar5._8_8_;
        uStack_9b0 = auVar4._0_8_;
        local_12e0 = local_9c0;
        uStack_12d8 = uStack_9b8;
        uStack_12d0 = uStack_9b0;
        fStack_12c8 = auVar4._8_4_;
      }
      else {
        puVar23 = (undefined8 *)(lVar24 + (long)local_ec0[1] * 4);
        local_12e0 = *puVar23;
        uStack_12d8 = puVar23[1];
        uStack_12d0 = puVar23[2];
        fStack_12c8 = (float)puVar23[3];
      }
      if (local_ec0[2] < 0) {
        auVar4 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
        local_980 = auVar5._0_8_;
        uStack_978 = auVar5._8_8_;
        uStack_970 = auVar4._0_8_;
        uStack_968 = auVar4._8_8_;
        local_1320 = local_980;
        uStack_1318 = uStack_978;
        uStack_1310 = uStack_970;
        uStack_1308 = uStack_968;
      }
      else {
        puVar23 = (undefined8 *)(lVar24 + (long)local_ec0[2] * 4);
        local_1320 = *puVar23;
        uStack_1318 = puVar23[1];
        uStack_1310 = puVar23[2];
        uStack_1308 = puVar23[3];
      }
      if (local_ec0[3] < 0) {
        auVar4 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
        local_940 = auVar5._0_8_;
        uStack_938 = auVar5._8_8_;
        uStack_930 = auVar4._0_8_;
        local_1360 = local_940;
        uStack_1358 = uStack_938;
        uStack_1350 = uStack_930;
        fStack_1348 = auVar4._8_4_;
      }
      else {
        puVar23 = (undefined8 *)(lVar24 + (long)local_ec0[3] * 4);
        local_1360 = *puVar23;
        uStack_1358 = puVar23[1];
        uStack_1350 = puVar23[2];
        fStack_1348 = (float)puVar23[3];
      }
      if (local_ec0[4] < 0) {
        auVar4 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
        local_900 = auVar5._0_8_;
        uStack_8f8 = auVar5._8_8_;
        uStack_8f0 = auVar4._0_8_;
        uStack_8e8 = auVar4._8_8_;
        local_13a0 = local_900;
        uStack_1398 = uStack_8f8;
        uStack_1390 = uStack_8f0;
        uStack_1388 = uStack_8e8;
      }
      else {
        puVar23 = (undefined8 *)(lVar24 + (long)local_ec0[4] * 4);
        local_13a0 = *puVar23;
        uStack_1398 = puVar23[1];
        uStack_1390 = puVar23[2];
        uStack_1388 = puVar23[3];
      }
      if (local_ec0[5] < 0) {
        auVar4 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
        local_8c0 = auVar5._0_8_;
        uStack_8b8 = auVar5._8_8_;
        uStack_8b0 = auVar4._0_8_;
        local_13e0 = local_8c0;
        uStack_13d8 = uStack_8b8;
        uStack_13d0 = uStack_8b0;
        fStack_13c8 = auVar4._8_4_;
      }
      else {
        puVar23 = (undefined8 *)(lVar24 + (long)local_ec0[5] * 4);
        local_13e0 = *puVar23;
        uStack_13d8 = puVar23[1];
        uStack_13d0 = puVar23[2];
        fStack_13c8 = (float)puVar23[3];
      }
      if (local_ec0[6] < 0) {
        auVar4 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
        local_880 = auVar5._0_8_;
        uStack_878 = auVar5._8_8_;
        uStack_870 = auVar4._0_8_;
        uStack_868 = auVar4._8_8_;
        local_1420 = local_880;
        uStack_1418 = uStack_878;
        uStack_1410 = uStack_870;
        uStack_1408 = uStack_868;
      }
      else {
        puVar23 = (undefined8 *)(lVar24 + (long)local_ec0[6] * 4);
        local_1420 = *puVar23;
        uStack_1418 = puVar23[1];
        uStack_1410 = puVar23[2];
        uStack_1408 = puVar23[3];
      }
      if (local_ec0[7] < 0) {
        auVar4 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0),0x30);
        local_840 = auVar5._0_8_;
        uStack_838 = auVar5._8_8_;
        uStack_830 = auVar4._0_8_;
        local_1460 = local_840;
        uStack_1458 = uStack_838;
        uStack_1450 = uStack_830;
        fStack_1448 = auVar4._8_4_;
      }
      else {
        puVar23 = (undefined8 *)(lVar24 + (long)local_ec0[7] * 4);
        local_1460 = *puVar23;
        uStack_1458 = puVar23[1];
        uStack_1450 = puVar23[2];
        fStack_1448 = (float)puVar23[3];
      }
      uVar1 = local_ec0[8];
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      auVar20._8_8_ = uStack_1298;
      auVar20._0_8_ = local_12a0;
      auVar20._16_8_ = uStack_1290;
      auVar20._24_8_ = uStack_1288;
      local_560 = (float)local_12a0;
      fStack_55c = (float)((ulong)local_12a0 >> 0x20);
      fStack_558 = (float)uStack_1298;
      fStack_554 = (float)((ulong)uStack_1298 >> 0x20);
      fStack_550 = (float)uStack_1290;
      fStack_54c = (float)((ulong)uStack_1290 >> 0x20);
      fStack_548 = (float)uStack_1288;
      uStack_544 = (undefined4)((ulong)uStack_1288 >> 0x20);
      local_580 = auVar4._0_4_;
      fStack_57c = auVar4._4_4_;
      fStack_578 = auVar4._8_4_;
      fStack_574 = auVar4._12_4_;
      fStack_570 = auVar5._0_4_;
      fStack_56c = auVar5._4_4_;
      fStack_568 = auVar5._8_4_;
      auVar7._4_4_ = fStack_55c * fStack_57c;
      auVar7._0_4_ = local_560 * local_580;
      auVar7._8_4_ = fStack_558 * fStack_578;
      auVar7._12_4_ = fStack_554 * fStack_574;
      auVar7._16_4_ = fStack_550 * fStack_570;
      auVar7._20_4_ = fStack_54c * fStack_56c;
      auVar7._24_4_ = fStack_548 * fStack_568;
      auVar7._28_4_ = uStack_544;
      auVar6 = vsubps_avx(auVar20,auVar7);
      local_3a0 = (float)local_12e0;
      fStack_39c = (float)((ulong)local_12e0 >> 0x20);
      fStack_398 = (float)uStack_12d8;
      fStack_394 = (float)((ulong)uStack_12d8 >> 0x20);
      fStack_390 = (float)uStack_12d0;
      fStack_38c = (float)((ulong)uStack_12d0 >> 0x20);
      fStack_3a4 = auVar5._12_4_;
      local_740 = auVar6._0_4_;
      fStack_73c = auVar6._4_4_;
      fStack_738 = auVar6._8_4_;
      fStack_734 = auVar6._12_4_;
      fStack_730 = auVar6._16_4_;
      fStack_72c = auVar6._20_4_;
      fStack_728 = auVar6._24_4_;
      fStack_724 = auVar6._28_4_;
      local_740 = local_3a0 * local_580 + local_740;
      fStack_73c = fStack_39c * fStack_57c + fStack_73c;
      fStack_738 = fStack_398 * fStack_578 + fStack_738;
      fStack_734 = fStack_394 * fStack_574 + fStack_734;
      fStack_730 = fStack_390 * fStack_570 + fStack_730;
      fStack_72c = fStack_38c * fStack_56c + fStack_72c;
      fStack_728 = fStack_12c8 * fStack_568 + fStack_728;
      auVar19._8_8_ = uStack_1318;
      auVar19._0_8_ = local_1320;
      auVar19._16_8_ = uStack_1310;
      auVar19._24_8_ = uStack_1308;
      local_520 = (float)local_1320;
      fStack_51c = (float)((ulong)local_1320 >> 0x20);
      fStack_518 = (float)uStack_1318;
      fStack_514 = (float)((ulong)uStack_1318 >> 0x20);
      fStack_510 = (float)uStack_1310;
      fStack_50c = (float)((ulong)uStack_1310 >> 0x20);
      fStack_508 = (float)uStack_1308;
      uStack_504 = (undefined4)((ulong)uStack_1308 >> 0x20);
      auVar8._4_4_ = fStack_51c * fStack_57c;
      auVar8._0_4_ = local_520 * local_580;
      auVar8._8_4_ = fStack_518 * fStack_578;
      auVar8._12_4_ = fStack_514 * fStack_574;
      auVar8._16_4_ = fStack_510 * fStack_570;
      auVar8._20_4_ = fStack_50c * fStack_56c;
      auVar8._24_4_ = fStack_508 * fStack_568;
      auVar8._28_4_ = uStack_504;
      auVar6 = vsubps_avx(auVar19,auVar8);
      local_360 = (float)local_1360;
      fStack_35c = (float)((ulong)local_1360 >> 0x20);
      fStack_358 = (float)uStack_1358;
      fStack_354 = (float)((ulong)uStack_1358 >> 0x20);
      fStack_350 = (float)uStack_1350;
      fStack_34c = (float)((ulong)uStack_1350 >> 0x20);
      local_700 = auVar6._0_4_;
      fStack_6fc = auVar6._4_4_;
      fStack_6f8 = auVar6._8_4_;
      fStack_6f4 = auVar6._12_4_;
      fStack_6f0 = auVar6._16_4_;
      fStack_6ec = auVar6._20_4_;
      fStack_6e8 = auVar6._24_4_;
      auVar18._8_8_ = uStack_1398;
      auVar18._0_8_ = local_13a0;
      auVar18._16_8_ = uStack_1390;
      auVar18._24_8_ = uStack_1388;
      local_4e0 = (float)local_13a0;
      fStack_4dc = (float)((ulong)local_13a0 >> 0x20);
      fStack_4d8 = (float)uStack_1398;
      fStack_4d4 = (float)((ulong)uStack_1398 >> 0x20);
      fStack_4d0 = (float)uStack_1390;
      fStack_4cc = (float)((ulong)uStack_1390 >> 0x20);
      fStack_4c8 = (float)uStack_1388;
      uStack_4c4 = (undefined4)((ulong)uStack_1388 >> 0x20);
      auVar9._4_4_ = fStack_4dc * fStack_57c;
      auVar9._0_4_ = local_4e0 * local_580;
      auVar9._8_4_ = fStack_4d8 * fStack_578;
      auVar9._12_4_ = fStack_4d4 * fStack_574;
      auVar9._16_4_ = fStack_4d0 * fStack_570;
      auVar9._20_4_ = fStack_4cc * fStack_56c;
      auVar9._24_4_ = fStack_4c8 * fStack_568;
      auVar9._28_4_ = uStack_4c4;
      auVar6 = vsubps_avx(auVar18,auVar9);
      local_320 = (float)local_13e0;
      fStack_31c = (float)((ulong)local_13e0 >> 0x20);
      fStack_318 = (float)uStack_13d8;
      fStack_314 = (float)((ulong)uStack_13d8 >> 0x20);
      fStack_310 = (float)uStack_13d0;
      fStack_30c = (float)((ulong)uStack_13d0 >> 0x20);
      local_6c0 = auVar6._0_4_;
      fStack_6bc = auVar6._4_4_;
      fStack_6b8 = auVar6._8_4_;
      fStack_6b4 = auVar6._12_4_;
      fStack_6b0 = auVar6._16_4_;
      fStack_6ac = auVar6._20_4_;
      fStack_6a8 = auVar6._24_4_;
      fStack_6a4 = auVar6._28_4_;
      local_6c0 = local_320 * local_580 + local_6c0;
      fStack_6bc = fStack_31c * fStack_57c + fStack_6bc;
      fStack_6b8 = fStack_318 * fStack_578 + fStack_6b8;
      fStack_6b4 = fStack_314 * fStack_574 + fStack_6b4;
      fStack_6b0 = fStack_310 * fStack_570 + fStack_6b0;
      fStack_6ac = fStack_30c * fStack_56c + fStack_6ac;
      fStack_6a8 = fStack_13c8 * fStack_568 + fStack_6a8;
      auVar17._8_8_ = uStack_1418;
      auVar17._0_8_ = local_1420;
      auVar17._16_8_ = uStack_1410;
      auVar17._24_8_ = uStack_1408;
      local_4a0 = (float)local_1420;
      fStack_49c = (float)((ulong)local_1420 >> 0x20);
      fStack_498 = (float)uStack_1418;
      fStack_494 = (float)((ulong)uStack_1418 >> 0x20);
      fStack_490 = (float)uStack_1410;
      fStack_48c = (float)((ulong)uStack_1410 >> 0x20);
      fStack_488 = (float)uStack_1408;
      uStack_484 = (undefined4)((ulong)uStack_1408 >> 0x20);
      auVar10._4_4_ = fStack_49c * fStack_57c;
      auVar10._0_4_ = local_4a0 * local_580;
      auVar10._8_4_ = fStack_498 * fStack_578;
      auVar10._12_4_ = fStack_494 * fStack_574;
      auVar10._16_4_ = fStack_490 * fStack_570;
      auVar10._20_4_ = fStack_48c * fStack_56c;
      auVar10._24_4_ = fStack_488 * fStack_568;
      auVar10._28_4_ = uStack_484;
      auVar6 = vsubps_avx(auVar17,auVar10);
      local_2e0 = (float)local_1460;
      fStack_2dc = (float)((ulong)local_1460 >> 0x20);
      fStack_2d8 = (float)uStack_1458;
      fStack_2d4 = (float)((ulong)uStack_1458 >> 0x20);
      fStack_2d0 = (float)uStack_1450;
      fStack_2cc = (float)((ulong)uStack_1450 >> 0x20);
      local_680 = auVar6._0_4_;
      fStack_67c = auVar6._4_4_;
      fStack_678 = auVar6._8_4_;
      fStack_674 = auVar6._12_4_;
      fStack_670 = auVar6._16_4_;
      fStack_66c = auVar6._20_4_;
      fStack_668 = auVar6._24_4_;
      uVar1 = local_ec0[9];
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      auVar16._4_4_ = fStack_73c;
      auVar16._0_4_ = local_740;
      auVar16._8_4_ = fStack_738;
      auVar16._12_4_ = fStack_734;
      auVar16._16_4_ = fStack_730;
      auVar16._20_4_ = fStack_72c;
      auVar16._24_4_ = fStack_728;
      auVar16._28_4_ = fStack_3a4 + fStack_724;
      local_480 = auVar4._0_4_;
      fStack_47c = auVar4._4_4_;
      fStack_478 = auVar4._8_4_;
      fStack_474 = auVar4._12_4_;
      fStack_470 = auVar5._0_4_;
      fStack_46c = auVar5._4_4_;
      fStack_468 = auVar5._8_4_;
      auVar11._4_4_ = fStack_73c * fStack_47c;
      auVar11._0_4_ = local_740 * local_480;
      auVar11._8_4_ = fStack_738 * fStack_478;
      auVar11._12_4_ = fStack_734 * fStack_474;
      auVar11._16_4_ = fStack_730 * fStack_470;
      auVar11._20_4_ = fStack_72c * fStack_46c;
      auVar11._24_4_ = fStack_728 * fStack_468;
      auVar11._28_4_ = fStack_3a4 + fStack_724;
      auVar6 = vsubps_avx(auVar16,auVar11);
      fStack_2a4 = auVar5._12_4_;
      local_640 = auVar6._0_4_;
      fStack_63c = auVar6._4_4_;
      fStack_638 = auVar6._8_4_;
      fStack_634 = auVar6._12_4_;
      fStack_630 = auVar6._16_4_;
      fStack_62c = auVar6._20_4_;
      fStack_628 = auVar6._24_4_;
      fStack_624 = auVar6._28_4_;
      local_640 = (local_360 * local_580 + local_700) * local_480 + local_640;
      fStack_63c = (fStack_35c * fStack_57c + fStack_6fc) * fStack_47c + fStack_63c;
      fStack_638 = (fStack_358 * fStack_578 + fStack_6f8) * fStack_478 + fStack_638;
      fStack_634 = (fStack_354 * fStack_574 + fStack_6f4) * fStack_474 + fStack_634;
      fStack_630 = (fStack_350 * fStack_570 + fStack_6f0) * fStack_470 + fStack_630;
      fStack_62c = (fStack_34c * fStack_56c + fStack_6ec) * fStack_46c + fStack_62c;
      fStack_628 = (fStack_1348 * fStack_568 + fStack_6e8) * fStack_468 + fStack_628;
      auVar15._4_4_ = fStack_6bc;
      auVar15._0_4_ = local_6c0;
      auVar15._8_4_ = fStack_6b8;
      auVar15._12_4_ = fStack_6b4;
      auVar15._16_4_ = fStack_6b0;
      auVar15._20_4_ = fStack_6ac;
      auVar15._24_4_ = fStack_6a8;
      auVar15._28_4_ = fStack_3a4 + fStack_6a4;
      auVar12._4_4_ = fStack_6bc * fStack_47c;
      auVar12._0_4_ = local_6c0 * local_480;
      auVar12._8_4_ = fStack_6b8 * fStack_478;
      auVar12._12_4_ = fStack_6b4 * fStack_474;
      auVar12._16_4_ = fStack_6b0 * fStack_470;
      auVar12._20_4_ = fStack_6ac * fStack_46c;
      auVar12._24_4_ = fStack_6a8 * fStack_468;
      auVar12._28_4_ = fStack_3a4 + fStack_6a4;
      auVar6 = vsubps_avx(auVar15,auVar12);
      local_600 = auVar6._0_4_;
      fStack_5fc = auVar6._4_4_;
      fStack_5f8 = auVar6._8_4_;
      fStack_5f4 = auVar6._12_4_;
      fStack_5f0 = auVar6._16_4_;
      fStack_5ec = auVar6._20_4_;
      fStack_5e8 = auVar6._24_4_;
      fStack_5e4 = auVar6._28_4_;
      uVar1 = local_ec0[10];
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      auVar14._4_4_ = fStack_63c;
      auVar14._0_4_ = local_640;
      auVar14._8_4_ = fStack_638;
      auVar14._12_4_ = fStack_634;
      auVar14._16_4_ = fStack_630;
      auVar14._20_4_ = fStack_62c;
      auVar14._24_4_ = fStack_628;
      auVar14._28_4_ = fStack_2a4 + fStack_624;
      local_400 = auVar5._0_4_;
      fStack_3fc = auVar5._4_4_;
      fStack_3f8 = auVar5._8_4_;
      fStack_3f4 = auVar5._12_4_;
      fStack_3f0 = auVar4._0_4_;
      fStack_3ec = auVar4._4_4_;
      fStack_3e8 = auVar4._8_4_;
      auVar13._4_4_ = fStack_63c * fStack_3fc;
      auVar13._0_4_ = local_640 * local_400;
      auVar13._8_4_ = fStack_638 * fStack_3f8;
      auVar13._12_4_ = fStack_634 * fStack_3f4;
      auVar13._16_4_ = fStack_630 * fStack_3f0;
      auVar13._20_4_ = fStack_62c * fStack_3ec;
      auVar13._24_4_ = fStack_628 * fStack_3e8;
      auVar13._28_4_ = fStack_2a4 + fStack_624;
      auVar6 = vsubps_avx(auVar14,auVar13);
      local_5c0 = auVar6._0_4_;
      fStack_5bc = auVar6._4_4_;
      fStack_5b8 = auVar6._8_4_;
      fStack_5b4 = auVar6._12_4_;
      fStack_5b0 = auVar6._16_4_;
      fStack_5ac = auVar6._20_4_;
      fStack_5a8 = auVar6._24_4_;
      fStack_5a4 = auVar6._28_4_;
      auVar6._4_4_ = ((fStack_2dc * fStack_57c + fStack_67c) * fStack_47c + fStack_5fc) * fStack_3fc
                     + fStack_5bc;
      auVar6._0_4_ = ((local_2e0 * local_580 + local_680) * local_480 + local_600) * local_400 +
                     local_5c0;
      auVar6._12_4_ =
           ((fStack_2d4 * fStack_574 + fStack_674) * fStack_474 + fStack_5f4) * fStack_3f4 +
           fStack_5b4;
      auVar6._8_4_ = ((fStack_2d8 * fStack_578 + fStack_678) * fStack_478 + fStack_5f8) * fStack_3f8
                     + fStack_5b8;
      auVar6._20_4_ =
           ((fStack_2cc * fStack_56c + fStack_66c) * fStack_46c + fStack_5ec) * fStack_3ec +
           fStack_5ac;
      auVar6._16_4_ =
           ((fStack_2d0 * fStack_570 + fStack_670) * fStack_470 + fStack_5f0) * fStack_3f0 +
           fStack_5b0;
      auVar6._28_4_ = fStack_2a4 + fStack_5e4 + fStack_5a4;
      auVar6._24_4_ =
           ((fStack_1448 * fStack_568 + fStack_668) * fStack_468 + fStack_5e8) * fStack_3e8 +
           fStack_5a8;
      *local_e70 = auVar6;
      local_e70 = local_e70 + 1;
      local_ec0 = local_ec0 + 0xb;
    }
  }
  return;
}

Assistant:

static void gridsample_3d_bilinear_apply_interpolation_p8(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            const int* offset_ptr = (int*)offset_value_ptr;
            const float* value_ptr = offset_value_ptr + 8;

            __m256 v000_val = offset_ptr[0] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[0]) : _mm256_set1_ps(0);
            __m256 v001_val = offset_ptr[1] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[1]) : _mm256_set1_ps(0);
            __m256 v010_val = offset_ptr[2] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[2]) : _mm256_set1_ps(0);
            __m256 v011_val = offset_ptr[3] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[3]) : _mm256_set1_ps(0);

            __m256 v100_val = offset_ptr[4] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[4]) : _mm256_set1_ps(0);
            __m256 v101_val = offset_ptr[5] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[5]) : _mm256_set1_ps(0);
            __m256 v110_val = offset_ptr[6] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[6]) : _mm256_set1_ps(0);
            __m256 v111_val = offset_ptr[7] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[7]) : _mm256_set1_ps(0);

            __m256 value = _mm256_set1_ps(value_ptr[0]);
            __m256 v00 = _mm256_comp_fmadd_ps(v001_val, value, _mm256_comp_fnmadd_ps(v000_val, value, v000_val));
            __m256 v01 = _mm256_comp_fmadd_ps(v011_val, value, _mm256_comp_fnmadd_ps(v010_val, value, v010_val));
            __m256 v10 = _mm256_comp_fmadd_ps(v101_val, value, _mm256_comp_fnmadd_ps(v100_val, value, v100_val));
            __m256 v11 = _mm256_comp_fmadd_ps(v111_val, value, _mm256_comp_fnmadd_ps(v110_val, value, v110_val));

            value = _mm256_set1_ps(value_ptr[1]);
            __m256 v0 = _mm256_comp_fmadd_ps(v01, value, _mm256_comp_fnmadd_ps(v00, value, v00));
            __m256 v1 = _mm256_comp_fmadd_ps(v11, value, _mm256_comp_fnmadd_ps(v10, value, v10));

            value = _mm256_set1_ps(value_ptr[2]);
            __m256 _v = _mm256_comp_fmadd_ps(v1, value, _mm256_comp_fnmadd_ps(v0, value, v0));
            _mm256_storeu_ps(dstptr, _v);

            dstptr += 8;
            offset_value_ptr += 11;
        }
    }
}